

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

UnicodeString * __thiscall icu_63::Formattable::getString(Formattable *this,UErrorCode *status)

{
  if (this->fType == kString) {
    if ((UnicodeString *)(this->fValue).fObject != (UnicodeString *)0x0) {
      return (UnicodeString *)(this->fValue).fObject;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  else if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *status = U_INVALID_FORMAT_ERROR;
  }
  return &this->fBogus;
}

Assistant:

const UnicodeString& 
Formattable::getString(UErrorCode& status) const 
{
    if (fType != kString) {
        setError(status, U_INVALID_FORMAT_ERROR);
        return *getBogus();
    }
    if (fValue.fString == NULL) {
        setError(status, U_MEMORY_ALLOCATION_ERROR);
        return *getBogus();
    }
    return *fValue.fString;
}